

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::serverupdate(void)

{
  clientinfo *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  vector<server::ban> vStack_48;
  void *local_38;
  
  iVar5 = totalmillis;
  lVar9 = connects;
  iVar3 = DAT_00193cc4;
  if ((shouldstep == '\x01') && (gamepaused == '\0')) {
    gamemillis = gamemillis + curtime;
    if (gamemode == -1) {
      readdemo();
      iVar5 = totalmillis;
      lVar9 = connects;
      iVar3 = DAT_00193cc4;
    }
    else if (((0x19 < gamemode + 3U) || ((0x3ffffe8UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0))
            || (gamemillis < gamelimit)) {
      processevents();
      if ((curtime != 0) && (updateBanner(), 0 < DAT_00193e6c)) {
        lVar9 = 8;
        uVar11 = 0;
        do {
          lVar12 = sents;
          iVar3 = curtime;
          iVar5 = *(int *)(sents + -4 + lVar9);
          if (iVar5 != 0) {
            uVar7 = iVar5 - curtime;
            *(uint *)(sents + -4 + lVar9) = uVar7;
            if (uVar7 == 0 || iVar5 < iVar3) {
              *(undefined4 *)(lVar12 + -4 + lVar9) = 0;
              *(undefined1 *)(lVar12 + lVar9) = 1;
              uVar6 = 0x19;
              uVar8 = uVar11 & 0xffffffff;
LAB_0013e3de:
              sendf(-1,1,"ri2",uVar6,uVar8);
            }
            else if (10000 < iVar5 && uVar7 < 0x2711) {
              uVar7 = *(uint *)(lVar12 + -8 + lVar9);
              uVar8 = (ulong)uVar7;
              if ((uVar7 == 0x12) || (uVar7 == 0xf)) {
                uVar6 = 0x46;
                goto LAB_0013e3de;
              }
            }
          }
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0xc;
        } while ((long)uVar11 < (long)DAT_00193e6c);
      }
      aiman::checkai();
      iVar5 = totalmillis;
      lVar9 = connects;
      iVar3 = DAT_00193cc4;
      if (smode != (long *)0x0) {
        (**(code **)(*smode + 0x60))();
        iVar5 = totalmillis;
        lVar9 = connects;
        iVar3 = DAT_00193cc4;
      }
    }
  }
  while ((totalmillis = iVar5, connects = lVar9, DAT_00193cc4 = iVar3, DAT_00193b7c != 0 &&
         (*(int *)(bannedips + 4) <= iVar5))) {
    vector<server::ban>::remove(&vStack_48,(char *)&bannedips);
    iVar5 = totalmillis;
    lVar9 = connects;
    iVar3 = DAT_00193cc4;
    if (local_38 != (void *)0x0) {
      operator_delete__(local_38);
      iVar5 = totalmillis;
      lVar9 = connects;
      iVar3 = DAT_00193cc4;
    }
  }
  if (0 < iVar3) {
    lVar12 = 0;
    do {
      lVar10 = *(long *)(lVar9 + lVar12 * 8);
      if (15000 < iVar5 - *(int *)(lVar10 + 0x10)) {
        disconnect_client(*(int *)(lVar10 + 8),8);
        lVar9 = connects;
        iVar3 = DAT_00193cc4;
        iVar5 = totalmillis;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar3);
  }
  if (((nextexceeded != 0) && (nextexceeded < gamemillis)) &&
     ((0x19 < gamemode + 3U ||
      (((0x3ffffe8UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0 || (gamemillis < gamelimit)))))) {
    nextexceeded = 0;
    if (0 < (long)DAT_00193844) {
      uVar11 = (long)DAT_00193844 + 1;
      do {
        pcVar1 = *(clientinfo **)(clients + -0x10 + uVar11 * 8);
        if ((pcVar1->state).super_fpsstate.aitype == 0) {
          bVar2 = clientinfo::checkexceeded(pcVar1);
          if (bVar2) {
            disconnect_client(pcVar1->clientnum,4);
          }
          else {
            clientinfo::scheduleexceeded(pcVar1);
          }
        }
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
  }
  checkteamkills();
  if ((shouldstep == '\x01') && (gamepaused == '\0')) {
    if ((gamemode + 3U < 0x1a) &&
       ((((0x3ffffe8UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0 && (smapname != '\0')) &&
        (curtime < gamemillis)))) {
      checkintermission(false);
    }
    if ((0 < interm) && (interm < gamemillis)) {
      if (demorecord != 0) {
        enddemorecord();
      }
      interm = -1;
      checkvotes(true);
    }
  }
  if (DAT_00193844 < 1) {
    shouldstep = false;
  }
  else {
    lVar9 = 0;
    iVar5 = DAT_00193844;
    do {
      pcVar1 = *(clientinfo **)(clients + lVar9 * 8);
      if ((long)multifragmillis <= (long)totalmillis - (pcVar1->state).lastfragmillis) {
        iVar5 = (pcVar1->state).multifrags;
        if (minmultikill <= iVar5) {
          lVar12 = (long)DAT_001942ec;
          if (0 < lVar12) {
            lVar10 = multikillmessages + 4;
            do {
              if (*(int *)(lVar10 + -4) == iVar5) {
                pcVar4 = colorname(pcVar1);
                out(3,"\f2%s scored a \f6%s",pcVar4,lVar10);
                goto LAB_0013e6a1;
              }
              lVar10 = lVar10 + 0x108;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          pcVar4 = colorname(pcVar1);
          out(3,"\f2%s scored a \f6%s (%d)",pcVar4,defmultikillmsg,
              (ulong)(uint)(pcVar1->state).multifrags);
        }
LAB_0013e6a1:
        (pcVar1->state).multifrags = 0;
        iVar5 = DAT_00193844;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar5);
    shouldstep = 0 < iVar5;
  }
  return;
}

Assistant:

void serverupdate()
    {
        if(shouldstep && !gamepaused)
        {
            gamemillis += curtime;
            
            if(m_demo) readdemo();
            else if(!m_timed || gamemillis < gamelimit)
            {
                processevents();
                if(curtime)
                {
                    updateBanner();
                    loopv(sents) if(sents[i].spawntime) //spawn entities when timer reached
                    {
                        int oldtime = sents[i].spawntime;
                        sents[i].spawntime -= curtime;
                        if(sents[i].spawntime<=0)
                        {
                            sents[i].spawntime = 0;
                            sents[i].spawned = true;
                            sendf(-1, 1, "ri2", N_ITEMSPAWN, i);
                        }
                        else if(sents[i].spawntime<=10000 && oldtime>10000 && (sents[i].type==I_QUAD || sents[i].type==I_BOOST))
                        {
                            sendf(-1, 1, "ri2", N_ANNOUNCE, sents[i].type);
                        }
                    }
                }
                aiman::checkai();
                if(smode) smode->update();
            }
        }
        
        while(bannedips.length() && bannedips[0].expire-totalmillis <= 0) bannedips.remove(0);
        loopv(connects) if(totalmillis-connects[i]->connectmillis>15000) disconnect_client(connects[i]->clientnum, DISC_TIMEOUT);
        if(nextexceeded && gamemillis > nextexceeded && (!m_timed || gamemillis < gamelimit))
        {
            nextexceeded = 0;
            loopvrev(clients)
            {
                clientinfo &c = *clients[i];
                if(c.state.aitype != AI_NONE) continue;
                if(c.checkexceeded()) disconnect_client(c.clientnum, DISC_MSGERR);
                else c.scheduleexceeded();
            }
        }
        checkteamkills();
        
        if(shouldstep && !gamepaused)
        {
            if(m_timed && smapname[0] && gamemillis-curtime>0) checkintermission();
            if(interm > 0 && gamemillis>interm)
            {
                if(demorecord) enddemorecord();
                interm = -1;
                checkvotes(true);
            }
        }
       	//multi kill
        loopv(clients) {
            clientinfo *ci = clients[i];
            if(totalmillis - ci->state.lastfragmillis >= (int64_t)multifragmillis) {
                if(ci->state.multifrags >= minmultikill) {
                    char *msg = NULL;
                    loopv(multikillmessages) {
                        if(multikillmessages[i].frags == ci->state.multifrags) {
                            msg = multikillmessages[i].msg;
                            break;
                        }
                    }
                    if(msg) out(ECHO_SERV,"\f2%s scored a \f6%s", colorname(ci), msg);
                    else out(ECHO_SERV,"\f2%s scored a \f6%s (%d)", colorname(ci), defmultikillmsg, ci->state.multifrags);
                }
                ci->state.multifrags = 0;
            }
        }
        shouldstep = clients.length() > 0;
    }